

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_common.c
# Opt level: O0

char * stringcache(StringCache *cache,char *str)

{
  size_t sVar1;
  char *pcVar2;
  char *str_local;
  StringCache *cache_local;
  
  sVar1 = strlen(str);
  pcVar2 = stringcache_len(cache,str,(uint)sVar1);
  return pcVar2;
}

Assistant:

const char *stringcache(StringCache *cache, const char *str)
{
    return stringcache_len(cache, str, strlen(str));
}